

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalMaterializedCTE::Deserialize(LogicalMaterializedCTE *this,Deserializer *deserializer)

{
  LogicalMaterializedCTE *this_00;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalMaterializedCTE_*,_false> local_20;
  
  this_00 = (LogicalMaterializedCTE *)operator_new(0x98);
  LogicalMaterializedCTE(this_00);
  local_20._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,200,"table_index",&pLVar1->table_index);
  pLVar1 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"column_count",&pLVar1->column_count);
  pLVar1 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xca,"ctename",&pLVar1->ctename);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalMaterializedCTE::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalMaterializedCTE>(new LogicalMaterializedCTE());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "column_count", result->column_count);
	deserializer.ReadPropertyWithDefault<string>(202, "ctename", result->ctename);
	return std::move(result);
}